

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::DrawColumnAddPalCommand>(void)

{
  DrawColumnAddPalCommand *this;
  bool bVar1;
  DrawerCommandQueue *this_00;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  value_type local_a8;
  DrawColumnAddPalCommand *local_a0;
  DrawColumnAddPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_7a;
  _lambda_void___1_ local_79;
  undefined1 auStack_78 [8];
  DrawColumnAddPalCommand command;
  DrawerCommandQueue *queue;
  
  this_00 = Instance();
  if ((this_00->threaded_render == 0) ||
     (bVar1 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar1)) {
    command.super_PalColumnCommand._srcblend = (uint32_t *)0x0;
    command.super_PalColumnCommand._destblend = (uint32_t *)0x0;
    command.super_PalColumnCommand._translation = (uint8_t *)0x0;
    command.super_PalColumnCommand._color = 0;
    command.super_PalColumnCommand._68_4_ = 0;
    command.super_PalColumnCommand._colormap = (uint8_t *)0x0;
    command.super_PalColumnCommand._source = (uint8_t *)0x0;
    command.super_PalColumnCommand._pitch = 0;
    command.super_PalColumnCommand._iscale = 0;
    command.super_PalColumnCommand._texturefrac = 0;
    command.super_PalColumnCommand._36_4_ = 0;
    command.super_PalColumnCommand.super_DrawerCommand._dest_y = 0;
    command.super_PalColumnCommand.super_DrawerCommand._12_4_ = 0;
    command.super_PalColumnCommand._dest = (uint8_t *)0x0;
    auStack_78 = (undefined1  [8])0x0;
    command.super_PalColumnCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    swrenderer::DrawColumnAddPalCommand::DrawColumnAddPalCommand
              ((DrawColumnAddPalCommand *)auStack_78);
    tryBlock = QueueCommand()::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_79);
    catchBlock = QueueCommand()::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_7a);
    VectoredTryCatch((DrawColumnAddPalCommand *)auStack_78,tryBlock,catchBlock);
    swrenderer::DrawColumnAddPalCommand::~DrawColumnAddPalCommand
              ((DrawColumnAddPalCommand *)auStack_78);
  }
  else {
    command_1 = (DrawColumnAddPalCommand *)AllocMemory(0x60);
    if (command_1 == (DrawColumnAddPalCommand *)0x0) {
      Finish(this_00);
      command_1 = (DrawColumnAddPalCommand *)AllocMemory(0x60);
      if (command_1 == (DrawColumnAddPalCommand *)0x0) {
        return;
      }
    }
    this = command_1;
    memset(command_1,0,0x60);
    swrenderer::DrawColumnAddPalCommand::DrawColumnAddPalCommand(this);
    local_a0 = this;
    local_a8 = (value_type)this;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              (&this_00->commands,&local_a8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}